

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O1

Generator<std::tuple<Rectangle>_> __thiscall
cppqc::tupleOf<Rectangle>(cppqc *this,Generator<Rectangle> *g)

{
  undefined4 extraout_var;
  TupleGenerator<Rectangle> local_10;
  
  local_10.m_gen.super__Tuple_impl<0UL,_cppqc::Generator<Rectangle>_>.
  super__Head_base<0UL,_cppqc::Generator<Rectangle>,_false>._M_head_impl.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl._0_4_ =
       (*((g->m_gen)._M_t.
          super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
          .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl)->
         _vptr_GenConcept[4])();
  local_10.m_gen.super__Tuple_impl<0UL,_cppqc::Generator<Rectangle>_>.
  super__Head_base<0UL,_cppqc::Generator<Rectangle>,_false>._M_head_impl.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl._4_4_ =
       extraout_var;
  Generator<std::tuple<Rectangle>>::Generator<cppqc::detail::TupleGenerator<Rectangle>>
            ((Generator<std::tuple<Rectangle>> *)this,&local_10);
  if ((_Tuple_impl<0UL,_cppqc::Generator<Rectangle>_>)
      local_10.m_gen.super__Tuple_impl<0UL,_cppqc::Generator<Rectangle>_>.
      super__Head_base<0UL,_cppqc::Generator<Rectangle>,_false>._M_head_impl.m_gen._M_t.
      super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
      .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl !=
      (Generator<Rectangle>)0x0) {
    (**(code **)(*(long *)local_10.m_gen.super__Tuple_impl<0UL,_cppqc::Generator<Rectangle>_>.
                          super__Head_base<0UL,_cppqc::Generator<Rectangle>,_false>._M_head_impl.
                          m_gen._M_t.
                          super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
                          .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>.
                          _M_head_impl + 8))();
  }
  return (unique_ptr<cppqc::detail::GenConcept<std::tuple<Rectangle>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>_>_>_>
          )(unique_ptr<cppqc::detail::GenConcept<std::tuple<Rectangle>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>_>_>_>
            )this;
}

Assistant:

Generator<std::tuple<T...>> tupleOf(const Generator<T>&... g) {
  return detail::TupleGenerator<T...>(g...);
}